

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedatabase.cpp
# Opt level: O2

QMimeType __thiscall
QMimeDatabase::mimeTypeForFileNameAndData(QMimeDatabase *this,QString *fileName,QIODevice *device)

{
  QString *nameOrAlias;
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_58;
  undefined1 local_40 [16];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_40._0_8_ = (fileName->d).d + 4;
  QBasicMutex::lock((QBasicMutex *)local_40._0_8_);
  local_40[8] = true;
  bVar1 = QString::endsWith((QString *)device,(QChar)0x2f,CaseSensitive);
  if (bVar1) {
    nameOrAlias = (QString *)(fileName->d).d;
    directoryMimeType();
    QMimeDatabasePrivate::mimeTypeForName((QMimeDatabasePrivate *)this,nameOrAlias);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_58);
  }
  else {
    this->d = (QMimeDatabasePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QMimeDatabasePrivate::mimeTypeForFileNameAndData
              ((QMimeDatabasePrivate *)this,(QString *)(fileName->d).d,device);
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QExplicitlySharedDataPointer<QMimeTypePrivate>)
           (QExplicitlySharedDataPointer<QMimeTypePrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QMimeType QMimeDatabase::mimeTypeForFileNameAndData(const QString &fileName, QIODevice *device) const
{
    QMutexLocker locker(&d->mutex);

    if (fileName.endsWith(u'/'))
        return d->mimeTypeForName(directoryMimeType());

    const QMimeType result = d->mimeTypeForFileNameAndData(fileName, device);
    return result;
}